

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NgammaT.cpp
# Opt level: O1

RealType __thiscall OpenMD::NgammaT::calcConservedQuantity(NgammaT *this)

{
  Thermo *this_00;
  double dVar1;
  double dVar2;
  int iVar3;
  SimInfo *this_01;
  undefined8 uVar4;
  int iVar5;
  double *pdVar6;
  uint i;
  long lVar7;
  Mat3x3d *pMVar8;
  double *pdVar9;
  uint j;
  long lVar10;
  Mat3x3d *pMVar11;
  uint k;
  long lVar12;
  double tmp_1;
  RealType RVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  pair<double,_double> pVar17;
  Mat3x3d hmat;
  SquareMatrix<double,_3> tmp;
  SquareMatrix3<double> result;
  Mat3x3d local_148;
  double local_f8;
  double local_e8;
  double dStack_e0;
  double local_d8;
  undefined8 uStack_d0;
  RealType local_c8;
  undefined8 uStack_c0;
  double adStack_b0 [19];
  
  pVar17 = Snapshot::getThermostat
                     ((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.snap);
  (this->super_NPT).thermostat = pVar17;
  (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator[0x18])(this);
  this_01 = (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.info_;
  (this->super_NPT).NkBT =
       (double)this_01->nGlobalIntegrableObjects_ * 8.31451e-07 * (this->super_NPT).targetTemp;
  iVar3 = this_01->ndf_;
  iVar5 = SimInfo::getFdf(this_01);
  (this->super_NPT).fkBT = (double)(iVar3 - iVar5) * 8.31451e-07 * (this->super_NPT).targetTemp;
  this_00 = &(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.thermo;
  RVar13 = Thermo::getTotalEnergy(this_00);
  local_c8 = (this->super_NPT).fkBT;
  uStack_c0 = 0;
  dVar1 = (this->super_NPT).tt2;
  dVar2 = (this->super_NPT).thermostat.first;
  local_e8 = (this->super_NPT).thermostat.second;
  pdVar6 = adStack_b0 + 9;
  adStack_b0[0xf] = 0.0;
  adStack_b0[0x10] = 0.0;
  adStack_b0[0xd] = 0.0;
  adStack_b0[0xe] = 0.0;
  adStack_b0[0xb] = 0.0;
  adStack_b0[0xc] = 0.0;
  adStack_b0[9] = 0.0;
  adStack_b0[10] = 0.0;
  adStack_b0[0x11] = 0.0;
  lVar7 = 0;
  pMVar8 = &this->eta;
  do {
    lVar10 = 0;
    pdVar9 = pdVar6;
    do {
      *pdVar9 = (pMVar8->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
                [lVar10];
      lVar10 = lVar10 + 1;
      pdVar9 = pdVar9 + 3;
    } while (lVar10 != 3);
    lVar7 = lVar7 + 1;
    pdVar6 = pdVar6 + 1;
    pMVar8 = (Mat3x3d *)
             ((pMVar8->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
  } while (lVar7 != 3);
  local_148.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = 0.0;
  local_148.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] = 0.0;
  local_148.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] = 0.0;
  local_148.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] = 0.0;
  local_148.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
  local_148.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] = 0.0;
  local_148.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
  local_148.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
  local_148.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] = 0.0;
  pdVar6 = adStack_b0 + 9;
  lVar7 = 0;
  do {
    lVar10 = 0;
    pMVar8 = &this->eta;
    do {
      pdVar9 = local_148.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[lVar7]
               + lVar10;
      dVar14 = *pdVar9;
      lVar12 = 0;
      pMVar11 = pMVar8;
      do {
        dVar14 = dVar14 + pdVar6[lVar12] *
                          (pMVar11->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                          data_[0][0];
        lVar12 = lVar12 + 1;
        pMVar11 = (Mat3x3d *)
                  ((pMVar11->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ +
                  1);
      } while (lVar12 != 3);
      *pdVar9 = dVar14;
      lVar10 = lVar10 + 1;
      pMVar8 = (Mat3x3d *)
               ((pMVar8->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0] +
               1);
    } while (lVar10 != 3);
    lVar7 = lVar7 + 1;
    pdVar6 = pdVar6 + 3;
  } while (lVar7 != 3);
  lVar7 = 0;
  do {
    *(undefined8 *)((long)adStack_b0 + lVar7 + 0x10) =
         *(undefined8 *)
          ((long)local_148.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
          lVar7 + 0x10);
    uVar4 = *(undefined8 *)
             ((long)local_148.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                    [0] + lVar7 + 8);
    *(undefined8 *)((long)adStack_b0 + lVar7) =
         *(undefined8 *)
          ((long)local_148.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
          lVar7);
    *(undefined8 *)((long)adStack_b0 + lVar7 + 8) = uVar4;
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 0x48);
  local_d8 = 0.0;
  lVar7 = 0;
  do {
    local_d8 = local_d8 + *(double *)((long)adStack_b0 + lVar7);
    lVar7 = lVar7 + 0x20;
  } while (lVar7 != 0x60);
  uStack_d0 = 0;
  dVar14 = (this->super_NPT).targetPressure;
  dStack_e0 = (this->super_NPT).NkBT * (this->super_NPT).tb2;
  local_f8 = Thermo::getVolume(this_00);
  Snapshot::getHmat(&local_148,
                    (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.snap);
  auVar15._0_8_ = local_c8 * local_e8;
  auVar15._8_8_ = local_d8 * dStack_e0;
  auVar15 = divpd(auVar15,_DAT_002a0d60);
  auVar16._8_8_ =
       *(double *)
        ((long)local_148.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
        (ulong)this->axis1_ * 0x20) *
       *(double *)
        ((long)local_148.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
        (ulong)this->axis2_ * 0x20) * this->surfaceTension_;
  auVar16._0_8_ = (local_f8 * dVar14) / 163882576.0;
  auVar16 = divpd(auVar16,_DAT_002a0d70);
  return (auVar15._8_8_ + RVar13 + (dVar1 * local_c8 * dVar2 * dVar2) / 0.0008368 + auVar15._0_8_ +
         auVar16._0_8_) - auVar16._8_8_;
}

Assistant:

RealType NgammaT::calcConservedQuantity() {
    thermostat = snap->getThermostat();
    loadEta();

    // We need NkBT a lot, so just set it here: This is the RAW number
    // of integrableObjects, so no subtraction or addition of constraints or
    // orientational degrees of freedom:
    NkBT = info_->getNGlobalIntegrableObjects() * Constants::kB * targetTemp;

    // fkBT is used because the thermostat operates on more degrees of freedom
    // than the barostat (when there are particles with orientational degrees
    // of freedom).
    fkBT = info_->getNdf() * Constants::kB * targetTemp;

    RealType totalEnergy = thermo.getTotalEnergy();

    RealType thermostat_kinetic = fkBT * tt2 * thermostat.first *
                                  thermostat.first /
                                  (2.0 * Constants::energyConvert);

    RealType thermostat_potential =
        fkBT * thermostat.second / Constants::energyConvert;

    SquareMatrix<RealType, 3> tmp = eta.transpose() * eta;
    RealType trEta                = tmp.trace();

    RealType barostat_kinetic =
        NkBT * tb2 * trEta / (2.0 * Constants::energyConvert);

    RealType barostat_potential =
        (targetPressure * thermo.getVolume() / Constants::pressureConvert) /
        Constants::energyConvert;

    Mat3x3d hmat  = snap->getHmat();
    RealType area = hmat(axis1_, axis1_) * hmat(axis2_, axis2_);

    RealType conservedQuantity =
        totalEnergy + thermostat_kinetic + thermostat_potential +
        barostat_kinetic + barostat_potential -
        surfaceTension_ * area / Constants::energyConvert;

    return conservedQuantity;
  }